

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

gravity_class_t * context_get_class(gvisitor_t *self)

{
  gravity_class_t *pgVar1;
  gravity_object_t *context_object;
  int i;
  size_t len;
  gravity_object_r ctx;
  gvisitor_t *self_local;
  
  context_object._4_4_ = (int)*self->data;
  do {
    context_object._4_4_ = context_object._4_4_ + -1;
    if (context_object._4_4_ < 0) {
      return (gravity_class_t *)0x0;
    }
    pgVar1 = *(gravity_class_t **)
              (*(long *)((long)self->data + 0x10) + (long)context_object._4_4_ * 8);
  } while (pgVar1->isa != gravity_class_class);
  return pgVar1;
}

Assistant:

static gravity_class_t *context_get_class (gvisitor_t *self) {
    gravity_object_r ctx = ((codegen_t *)self->data)->context;
    size_t len = marray_size(ctx);
    
    for (int i=(int)len-1; i>=0; --i) {
        gravity_object_t *context_object = (gravity_object_t *)marray_get(ctx, i);
        if (OBJECT_ISA_CLASS(context_object)) return (gravity_class_t *)context_object;
    }
    
    return NULL;
}